

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# share.c
# Opt level: O0

CURLSHcode curl_share_setopt(CURLSH *sh,CURLSHoption option,...)

{
  char in_AL;
  CookieInfo *pCVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_128 [16];
  undefined8 local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  CURLSHcode local_6c;
  CURLSHcode res;
  void *ptr;
  curl_unlock_function unlockfunc;
  curl_lock_function lockfunc;
  undefined4 local_48;
  int type;
  va_list param;
  Curl_share *share;
  CURLSHoption option_local;
  CURLSH *sh_local;
  
  if (in_AL != '\0') {
    local_f8 = in_XMM0_Qa;
    local_e8 = in_XMM1_Qa;
    local_d8 = in_XMM2_Qa;
    local_c8 = in_XMM3_Qa;
    local_b8 = in_XMM4_Qa;
    local_a8 = in_XMM5_Qa;
    local_98 = in_XMM6_Qa;
    local_88 = in_XMM7_Qa;
  }
  if (*(int *)((long)sh + 4) == 0) {
    param[0].overflow_arg_area = local_128;
    param[0]._0_8_ = &stack0x00000008;
    local_110 = in_RCX;
    local_108 = in_R8;
    local_100 = in_R9;
    switch(option) {
    case CURLSHOPT_SHARE:
      type = 0x30;
      local_48 = 0x18;
      local_6c = CURLSHE_OK;
      lockfunc._4_4_ = (uint)local_118;
      *(uint *)sh = *sh | 1 << ((uint)local_118 & 0x1f);
      switch((uint)local_118) {
      case 2:
        if (*(long *)((long)sh + 0x50) == 0) {
          local_118 = in_RDX;
          pCVar1 = Curl_cookie_init((SessionHandle *)0x0,(char *)0x0,(CookieInfo *)0x0,true);
          *(CookieInfo **)((long)sh + 0x50) = pCVar1;
          if (*(long *)((long)sh + 0x50) == 0) {
            local_6c = CURLSHE_NOMEM;
          }
        }
        break;
      case 3:
        break;
      case 4:
        local_6c = CURLSHE_NOT_BUILT_IN;
        break;
      case 5:
        break;
      default:
        local_6c = CURLSHE_BAD_OPTION;
      }
      break;
    case CURLSHOPT_UNSHARE:
      type = 0x30;
      local_48 = 0x18;
      local_6c = CURLSHE_OK;
      lockfunc._4_4_ = (uint)local_118;
      *(uint *)sh = *sh & ~(1 << ((uint)local_118 & 0x1f));
      switch((uint)local_118) {
      case 2:
        if (*(long *)((long)sh + 0x50) != 0) {
          local_118 = in_RDX;
          Curl_cookie_cleanup(*(CookieInfo **)((long)sh + 0x50));
          *(undefined8 *)((long)sh + 0x50) = 0;
        }
        break;
      case 3:
        break;
      case 4:
        local_6c = CURLSHE_NOT_BUILT_IN;
        break;
      case 5:
        break;
      default:
        local_6c = CURLSHE_BAD_OPTION;
      }
      break;
    case CURLSHOPT_LOCKFUNC:
      local_6c = CURLSHE_OK;
      *(undefined8 *)((long)sh + 8) = local_118;
      break;
    case CURLSHOPT_UNLOCKFUNC:
      local_6c = CURLSHE_OK;
      *(undefined8 *)((long)sh + 0x10) = local_118;
      break;
    case CURLSHOPT_USERDATA:
      local_6c = CURLSHE_OK;
      *(undefined8 *)((long)sh + 0x18) = local_118;
      break;
    default:
      local_6c = CURLSHE_BAD_OPTION;
    }
    sh_local._4_4_ = local_6c;
  }
  else {
    sh_local._4_4_ = CURLSHE_IN_USE;
  }
  return sh_local._4_4_;
}

Assistant:

CURLSHcode
curl_share_setopt(CURLSH *sh, CURLSHoption option, ...)
{
  struct Curl_share *share = (struct Curl_share *)sh;
  va_list param;
  int type;
  curl_lock_function lockfunc;
  curl_unlock_function unlockfunc;
  void *ptr;
  CURLSHcode res = CURLSHE_OK;

  if(share->dirty)
    /* don't allow setting options while one or more handles are already
       using this share */
    return CURLSHE_IN_USE;

  va_start(param, option);

  switch(option) {
  case CURLSHOPT_SHARE:
    /* this is a type this share will share */
    type = va_arg(param, int);
    share->specifier |= (1<<type);
    switch( type ) {
    case CURL_LOCK_DATA_DNS:
      break;

    case CURL_LOCK_DATA_COOKIE:
#if !defined(CURL_DISABLE_HTTP) && !defined(CURL_DISABLE_COOKIES)
      if(!share->cookies) {
        share->cookies = Curl_cookie_init(NULL, NULL, NULL, TRUE );
        if(!share->cookies)
          res = CURLSHE_NOMEM;
      }
#else   /* CURL_DISABLE_HTTP */
      res = CURLSHE_NOT_BUILT_IN;
#endif
      break;

    case CURL_LOCK_DATA_SSL_SESSION:
#ifdef USE_SSL
      if(!share->sslsession) {
        share->max_ssl_sessions = 8;
        share->sslsession = calloc(share->max_ssl_sessions,
                                   sizeof(struct curl_ssl_session));
        share->sessionage = 0;
        if(!share->sslsession)
          res = CURLSHE_NOMEM;
      }
#else
      res = CURLSHE_NOT_BUILT_IN;
#endif
      break;

    case CURL_LOCK_DATA_CONNECT:     /* not supported (yet) */
      break;

    default:
      res = CURLSHE_BAD_OPTION;
    }
    break;

  case CURLSHOPT_UNSHARE:
    /* this is a type this share will no longer share */
    type = va_arg(param, int);
    share->specifier &= ~(1<<type);
    switch( type ) {
    case CURL_LOCK_DATA_DNS:
      break;

    case CURL_LOCK_DATA_COOKIE:
#if !defined(CURL_DISABLE_HTTP) && !defined(CURL_DISABLE_COOKIES)
      if(share->cookies) {
        Curl_cookie_cleanup(share->cookies);
        share->cookies = NULL;
      }
#else   /* CURL_DISABLE_HTTP */
      res = CURLSHE_NOT_BUILT_IN;
#endif
      break;

    case CURL_LOCK_DATA_SSL_SESSION:
#ifdef USE_SSL
      Curl_safefree(share->sslsession);
#else
      res = CURLSHE_NOT_BUILT_IN;
#endif
      break;

    case CURL_LOCK_DATA_CONNECT:
      break;

    default:
      res = CURLSHE_BAD_OPTION;
      break;
    }
    break;

  case CURLSHOPT_LOCKFUNC:
    lockfunc = va_arg(param, curl_lock_function);
    share->lockfunc = lockfunc;
    break;

  case CURLSHOPT_UNLOCKFUNC:
    unlockfunc = va_arg(param, curl_unlock_function);
    share->unlockfunc = unlockfunc;
    break;

  case CURLSHOPT_USERDATA:
    ptr = va_arg(param, void *);
    share->clientdata = ptr;
    break;

  default:
    res = CURLSHE_BAD_OPTION;
    break;
  }

  va_end(param);

  return res;
}